

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O1

string * __thiscall
Reflection::StructImpl<Enterprise::Machine::Options>::name_of_abi_cxx11_
          (string *__return_storage_ptr__,StructImpl<Enterprise::Machine::Options> *this,void *field
          )

{
  __node_base *p_Var1;
  
  p_Var1 = &contents__abi_cxx11_._M_h._M_before_begin;
  do {
    p_Var1 = p_Var1->_M_nxt;
    if (p_Var1 == (__node_base *)0x0) goto LAB_00337d0d;
  } while (p_Var1[6]._M_nxt != (_Hash_node_base *)((long)field - (long)this));
  if (p_Var1 == (__node_base *)0x0) {
LAB_00337d0d:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var1[1]._M_nxt,
               (long)&(p_Var1[1]._M_nxt)->_M_nxt +
               (long)&(*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor)->_M_nxt);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string name_of(void *field) {
			const ssize_t offset = reinterpret_cast<uint8_t *>(field) - reinterpret_cast<uint8_t *>(this);

			auto iterator = contents_.begin();
			while(iterator != contents_.end()) {
				if(iterator->second.offset == offset) break;
				++iterator;
			}

			if(iterator != contents_.end()) {
				return iterator->first;
			} else {
				return std::string();
			}
		}